

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_posix_file_impl.h
# Opt level: O3

int64_t default_query_size_func(exr_const_context_t_conflict ctxt,void *userdata)

{
  int iVar1;
  _internal_exr_filehandle *fh;
  stat sbuf;
  stat sStack_98;
  
  if (-1 < *userdata) {
    iVar1 = fstat(*userdata,&sStack_98);
    return -(ulong)(iVar1 != 0) | sStack_98.st_size;
  }
  return -1;
}

Assistant:

static int64_t
default_query_size_func (exr_const_context_t ctxt, void* userdata)
{
    struct stat                      sbuf;
    struct _internal_exr_filehandle* fh = userdata;
    int64_t                          sz = -1;

    if (fh->fd >= 0)
    {
        int rv = fstat (fh->fd, &sbuf);
        if (rv == 0) sz = (int64_t) sbuf.st_size;
    }

    (void) ctxt;
    return sz;
}